

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDDOMParser::docCharacters
          (XSDDOMParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  bool bVar1;
  ReaderMgr *pRVar2;
  XMLReader *this_00;
  uint local_4c;
  undefined1 auStack_48 [4];
  uint i;
  LastExtEntityInfo lastInfo;
  bool cdataSection_local;
  XMLSize_t length_local;
  XMLCh *chars_local;
  XSDDOMParser *this_local;
  
  if (((this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement & 1U) != 0) {
    lastInfo.colNumber._7_1_ = cdataSection;
    if (this->fInnerAnnotationDepth == -1) {
      pRVar2 = XMLScanner::getReaderMgr
                         ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
      this_00 = ReaderMgr::getCurrentReader(pRVar2);
      bVar1 = XMLReader::isAllSpaces(this_00,chars,length);
      if (!bVar1) {
        ReaderMgr::LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)auStack_48);
        pRVar2 = XMLScanner::getReaderMgr
                           ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
        ReaderMgr::getLastExtEntityInfo(pRVar2,(LastExtEntityInfo *)auStack_48);
        XSDLocator::setValues
                  (&this->fXSLocator,_auStack_48,lastInfo.systemId,(XMLFileLoc)lastInfo.publicId,
                   lastInfo.lineNumber);
        XSDErrorReporter::emitError
                  (&this->fXSDErrorReporter,0x49,(XMLCh *)XMLUni::fgValidityDomain,
                   &(this->fXSLocator).super_Locator);
      }
    }
    else if (cdataSection) {
      XMLBuffer::append(&this->fAnnotationBuf,(XMLCh *)XMLUni::fgCDataStart);
      XMLBuffer::append(&this->fAnnotationBuf,chars,length);
      XMLBuffer::append(&this->fAnnotationBuf,L"]]>");
    }
    else {
      for (local_4c = 0; local_4c < length; local_4c = local_4c + 1) {
        if (chars[local_4c] == L'&') {
          XMLBuffer::append(&this->fAnnotationBuf,L'&');
          XMLBuffer::append(&this->fAnnotationBuf,L"amp");
          XMLBuffer::append(&this->fAnnotationBuf,L';');
        }
        else if (chars[local_4c] == L'<') {
          XMLBuffer::append(&this->fAnnotationBuf,L'&');
          XMLBuffer::append(&this->fAnnotationBuf,L"lt");
          XMLBuffer::append(&this->fAnnotationBuf,L';');
        }
        else {
          XMLBuffer::append(&this->fAnnotationBuf,chars[local_4c]);
        }
      }
    }
  }
  return;
}

Assistant:

void XSDDOMParser::docCharacters(  const   XMLCh* const    chars
                              , const XMLSize_t       length
                              , const bool            cdataSection)
{
    // Ignore chars outside of content
    if (!fWithinElement)
        return;

    if (fInnerAnnotationDepth == -1)
    {
        if (!((ReaderMgr*) fScanner->getReaderMgr())->getCurrentReader()->isAllSpaces(chars, length))
        {
            ReaderMgr::LastExtEntityInfo lastInfo;
            fScanner->getReaderMgr()->getLastExtEntityInfo(lastInfo);
            fXSLocator.setValues(lastInfo.systemId, lastInfo.publicId, lastInfo.lineNumber, lastInfo.colNumber);
            fXSDErrorReporter.emitError(XMLValid::NonWSContent, XMLUni::fgValidityDomain, &fXSLocator);
        }
    }
    // when it's within either of the 2 annotation subelements, characters are
    // allowed and we need to store them.
    else if (cdataSection == true)
    {
        fAnnotationBuf.append(XMLUni::fgCDataStart);
        fAnnotationBuf.append(chars, length);
        fAnnotationBuf.append(XMLUni::fgCDataEnd);
    }
    else
    {
        for(unsigned int i = 0; i < length; i++ )
        {
            if(chars[i] == chAmpersand)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgAmp);
                fAnnotationBuf.append(chSemiColon);
            }
            else if (chars[i] == chOpenAngle)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgLT);
                fAnnotationBuf.append(chSemiColon);
            }
            else {
                fAnnotationBuf.append(chars[i]);
            }
        }
    }
}